

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseDoStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *block_00;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  TokenDetail *unaff_retaddr;
  ParserImpl *in_stack_00000008;
  ParseException *in_stack_00000010;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff88;
  ParserImpl *in_stack_ffffffffffffff90;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_00;
  DoStatement *in_stack_ffffffffffffffa0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_30 [6];
  
  NextToken(in_stack_ffffffffffffff90);
  if (*(int *)(in_RSI + 0x20) != 0x102) {
    __assert_fail("current_.token_ == Token_Do",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x11c,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseDoStatement()"
                 );
  }
  ParseBlock(in_stack_00000008);
  pTVar1 = NextToken(in_stack_ffffffffffffff90);
  if (pTVar1->token_ != 0x105) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException(in_stack_00000010,(char *)in_stack_00000008,unaff_retaddr);
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  block_00 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             operator_new(0x10);
  this_00 = local_30;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            (this_00,in_stack_ffffffffffffff88);
  luna::DoStatement::DoStatement(in_stack_ffffffffffffffa0,block_00);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>(this_00,(pointer)in_stack_ffffffffffffff88)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffffa0);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffffa0);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseDoStatement()
        {
            NextToken();                // skip 'do'
            assert(current_.token_ == Token_Do);

            std::unique_ptr<SyntaxTree> block = ParseBlock();
            if (NextToken().token_ != Token_End)
                throw ParseException("expect 'end' for do-statement", current_);

            return std::unique_ptr<SyntaxTree>(new DoStatement(std::move(block)));
        }